

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O1

void capnp::_::
     checkList<capnp::List<int,_(capnp::Kind)0>::Builder,_capnp::List<int,_(capnp::Kind)0>,_false>
               (Builder reader,initializer_list<int> expected)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  bool bVar4;
  Fault f;
  ulong local_40;
  ListElementCount local_34;
  
  uVar2 = expected._M_len;
  if (reader.builder.elementCount == uVar2) {
    if (uVar2 != 0) {
      uVar1 = 0;
      uVar3 = 1;
      do {
        f.exception._0_4_ = expected._M_array[uVar1];
        local_40 = CONCAT44(local_40._4_4_,
                            *(int *)(reader.builder.ptr + (uVar1 * reader.builder.step >> 3)));
        if (((int)f.exception != *(int *)(reader.builder.ptr + (uVar1 * reader.builder.step >> 3)))
           && (kj::_::Debug::minSeverity < 3)) {
          kj::_::Debug::log<char_const(&)[28],int&,int&>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.h"
                     ,0x72,ERROR,"\"failed: expected \" \"(a) == (b)\", a, b",
                     (char (*) [28])"failed: expected (a) == (b)",(int *)&f,(int *)&local_40);
        }
        bVar4 = uVar3 < uVar2;
        uVar1 = uVar3;
        uVar3 = (ulong)((int)uVar3 + 1);
      } while (bVar4);
    }
    return;
  }
  local_34 = reader.builder.elementCount;
  local_40 = uVar2;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_long,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.h"
             ,0x89,FAILED,"(expected.size()) == (reader.size())","expected.size(), reader.size()",
             &local_40,&local_34);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void checkList(T reader, std::initializer_list<decltype(typename L::Reader()[0])> expected) {
  ASSERT_EQ(expected.size(), reader.size());
  for (uint i = 0; i < expected.size(); i++) {
    checkElement<decltype(typename L::Reader()[0])>(expected.begin()[i], reader[i]);
  }
}